

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O1

void __thiscall
Salsa20Cipher::processBytes(Salsa20Cipher *this,uint8_t *in,uint8_t *out,size_t byteCount)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  uint8_t keyStream [64];
  byte local_68 [64];
  
  if (byteCount != 0) {
    do {
      generateKeyStream(this,local_68);
      uVar1 = 0x40;
      if (byteCount < 0x40) {
        uVar1 = byteCount;
      }
      lVar2 = uVar1 + (uVar1 == 0);
      lVar3 = 0;
      do {
        out[lVar3] = in[lVar3] ^ local_68[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
      in = in + lVar3;
      out = out + lVar3;
      byteCount = byteCount - lVar2;
    } while (byteCount != 0);
  }
  return;
}

Assistant:

void processBytes(const uint8_t* in, uint8_t* out, size_t byteCount)
	{
		uint8_t keyStream[BLOCK_SIZE];

		while (byteCount != 0) {
			generateKeyStream(keyStream);

			const auto count = byteCount < BLOCK_SIZE ? byteCount : BLOCK_SIZE;
			for (auto i = 0u; i < count; ++i, --byteCount)
				*out++ = keyStream[i] ^ *in++;
		}
	}